

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t array_container_read(int32_t cardinality,array_container_t *container,char *buf)

{
  int32_t iVar1;
  void *in_RDX;
  array_container_t *in_RSI;
  int in_EDI;
  _Bool in_stack_fffffffffffffffb;
  
  if (in_RSI->capacity < in_EDI) {
    array_container_grow((array_container_t *)buf,in_EDI,in_stack_fffffffffffffffb);
  }
  in_RSI->cardinality = in_EDI;
  memcpy(in_RSI->array,in_RDX,(long)in_RSI->cardinality << 1);
  iVar1 = array_container_size_in_bytes(in_RSI);
  return iVar1;
}

Assistant:

int32_t array_container_read(int32_t cardinality, array_container_t *container,
                             const char *buf) {
    if (container->capacity < cardinality) {
        array_container_grow(container, cardinality, false);
    }
    container->cardinality = cardinality;
    memcpy(container->array, buf, container->cardinality * sizeof(uint16_t));

    return array_container_size_in_bytes(container);
}